

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:522:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::_::Void,_kj::String,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:522:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  char *in_RCX;
  InitializeableArray<kj::StringPtr> *arr;
  long lVar10;
  char *__s2;
  Exception *this_00;
  char *ptrCopy;
  char *pcVar11;
  bool bVar12;
  ExceptionOr<kj::String> depResult;
  ExceptionOrValue local_5c8;
  char local_468;
  char *local_460;
  size_t sStack_458;
  ArrayDisposer *local_450;
  Exception local_448;
  ExceptionOrValue local_2f0;
  char local_190;
  Exception local_188;
  
  local_5c8.exception.ptr.isSet = false;
  local_468 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_5c8);
  sVar6 = sStack_458;
  pcVar11 = local_460;
  uVar5 = local_5c8.exception.ptr.field_1.value.context.ptr.ptr;
  uVar4 = local_5c8.exception.ptr.field_1.value.description.content.size_;
  uVar3 = local_5c8.exception.ptr.field_1.value.description.content.ptr;
  uVar2 = local_5c8.exception.ptr.field_1.value.ownFile.content.size_;
  uVar1 = local_5c8.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_5c8.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_5c8.exception.ptr.field_1 + 0x50);
    local_448.ownFile.content.disposer =
         local_5c8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_5c8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_5c8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_448.file = local_5c8.exception.ptr.field_1.value.file;
    local_448.line = local_5c8.exception.ptr.field_1.value.line;
    local_448.type = local_5c8.exception.ptr.field_1.value.type;
    local_448.description.content.disposer =
         local_5c8.exception.ptr.field_1.value.description.content.disposer;
    local_5c8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_5c8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_448.context.ptr.disposer = local_5c8.exception.ptr.field_1.value.context.ptr.disposer;
    local_5c8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_448.trace,__src,0x104);
    local_188.ownFile.content.disposer =
         local_5c8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_448.ownFile.content.ptr = (char *)0x0;
    local_448.ownFile.content.size_ = 0;
    local_188.file = local_5c8.exception.ptr.field_1.value.file;
    local_188.line = local_5c8.exception.ptr.field_1.value.line;
    local_188.type = local_5c8.exception.ptr.field_1.value.type;
    local_188.description.content.disposer =
         local_5c8.exception.ptr.field_1.value.description.content.disposer;
    local_448.description.content.ptr = (char *)0x0;
    local_448.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_5c8.exception.ptr.field_1.value.context.ptr.disposer;
    local_448.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2f0.exception.ptr.isSet = true;
    local_2f0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar1;
    local_2f0.exception.ptr.field_1.value.ownFile.content.size_ = uVar2;
    local_2f0.exception.ptr.field_1.value.ownFile.content.disposer =
         local_5c8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2f0.exception.ptr.field_1.value.file = local_5c8.exception.ptr.field_1.value.file;
    local_2f0.exception.ptr.field_1._32_8_ = local_5c8.exception.ptr.field_1._32_8_;
    local_2f0.exception.ptr.field_1.value.description.content.ptr = (char *)uVar3;
    local_2f0.exception.ptr.field_1.value.description.content.size_ = uVar4;
    local_2f0.exception.ptr.field_1.value.description.content.disposer =
         local_5c8.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2f0.exception.ptr.field_1.value.context.ptr.disposer =
         local_5c8.exception.ptr.field_1.value.context.ptr.disposer;
    local_2f0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar5;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_2f0.exception.ptr.field_1 + 0x50),__src,0x104);
    local_190 = '\0';
    Exception::~Exception(&local_188);
    ExceptionOrValue::operator=(output,&local_2f0);
    if (&local_2f0 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_190 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_2f0.exception.ptr.isSet == true) {
      Exception::~Exception(&local_2f0.exception.ptr.field_1.value);
    }
    this_00 = &local_448;
  }
  else {
    if (local_468 != '\x01') goto LAB_0026bd51;
    local_448.ownFile.content.ptr = local_460;
    local_448.ownFile.content.size_ = sStack_458;
    local_448.ownFile.content.disposer = local_450;
    local_460 = (char *)0x0;
    sStack_458 = 0;
    strArray<kj::(anonymous_namespace)::InitializeableArray<kj::StringPtr>const&>
              (&local_188.ownFile,(kj *)&((this->func).testCase)->responseBodyParts,arr,in_RCX);
    sVar8 = local_188.ownFile.content.size_;
    pcVar7 = local_188.ownFile.content.ptr;
    lVar10 = local_188.ownFile.content.size_ + (local_188.ownFile.content.size_ == 0);
    bVar12 = true;
    if (sVar6 + (sVar6 == 0) == lVar10) {
      __s2 = local_188.ownFile.content.ptr;
      if (local_188.ownFile.content.size_ == 0) {
        __s2 = "";
      }
      if (sVar6 == 0) {
        pcVar11 = "";
      }
      iVar9 = bcmp(pcVar11,__s2,lVar10 - 1);
      bVar12 = iVar9 != 0;
    }
    if (pcVar7 != (char *)0x0) {
      local_188.ownFile.content.ptr = (char *)0x0;
      local_188.ownFile.content.size_ = 0;
      (**(local_188.ownFile.content.disposer)->_vptr_ArrayDisposer)
                (local_188.ownFile.content.disposer,pcVar7,1,sVar8,sVar8,0);
    }
    if ((bool)(bVar12 & Debug::minSeverity < 3)) {
      Debug::log<char_const(&)[70],kj::String&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x20b,ERROR,
                 "\"failed: expected \" \"body == kj::strArray(testCase.responseBodyParts, \\\"\\\")\", body"
                 ,(char (*) [70])
                  "failed: expected body == kj::strArray(testCase.responseBodyParts, \"\")",
                 &local_448.ownFile);
    }
    sVar6 = local_448.ownFile.content.size_;
    pcVar11 = local_448.ownFile.content.ptr;
    if (local_448.ownFile.content.ptr != (char *)0x0) {
      local_448.ownFile.content.ptr = (char *)0x0;
      local_448.ownFile.content.size_ = 0;
      (**(local_448.ownFile.content.disposer)->_vptr_ArrayDisposer)
                (local_448.ownFile.content.disposer,pcVar11,1,sVar6,sVar6,0);
    }
    local_2f0.exception.ptr.isSet = false;
    local_190 = '\x01';
    ExceptionOrValue::operator=(output,&local_2f0);
    if (&local_2f0 != output) {
      if (output[1].exception.ptr.isSet == true) {
        output[1].exception.ptr.isSet = false;
      }
      if (local_190 == '\x01') {
        output[1].exception.ptr.isSet = true;
      }
    }
    if (local_2f0.exception.ptr.isSet != true) goto LAB_0026bd51;
    this_00 = (Exception *)&local_2f0.exception.ptr.field_1;
  }
  Exception::~Exception(this_00);
LAB_0026bd51:
  sVar6 = sStack_458;
  pcVar11 = local_460;
  if ((local_468 == '\x01') && (local_460 != (char *)0x0)) {
    local_460 = (char *)0x0;
    sStack_458 = 0;
    (**local_450->_vptr_ArrayDisposer)(local_450,pcVar11,1,sVar6,sVar6,0);
  }
  if (local_5c8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_5c8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }